

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall Liby::Connection::handleWritEvent(Connection *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Any_data *p_Var2;
  Buffer *this_01;
  _Head_base<0UL,_std::function<void_()>_*,_false> _Var3;
  ssize_t sVar4;
  int *piVar5;
  ulong uVar6;
  off_t oVar7;
  long lVar8;
  bool bVar9;
  io_task *x;
  _Elt_pointer piVar10;
  uint uVar11;
  _Elt_pointer piVar12;
  _Elt_pointer piVar13;
  _Map_pointer ppiVar14;
  deque<Liby::io_task,_std::allocator<Liby::io_task>_> *__range3;
  off_t offset;
  iovec v;
  Connection *local_88;
  iterator iStack_80;
  iovec *local_78;
  undefined8 uStack_70;
  iovec local_68;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  this_00 = (this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  iStack_80._M_current = (iovec *)0x0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:169:17)>
             ::_M_invoke;
  local_58._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:169:17)>
             ::_M_manager;
  local_78 = (iovec *)0x0;
  uStack_70 = 0;
  local_88 = this;
  local_58._M_unused._M_object = this;
  DeferCaller::~DeferCaller((DeferCaller *)&local_58);
  if (local_78 != (iovec *)0x0) {
    (*(code *)local_78)(&local_88,&local_88,3);
  }
  piVar10 = (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  piVar12 = (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar12 != piVar10) {
    do {
      peVar1 = (piVar10->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (peVar1 == (element_type *)0x0) {
        local_88 = (Connection *)0x0;
        iStack_80._M_current = (iovec *)0x0;
        local_78 = (iovec *)0x0;
        if (piVar10 != piVar12) {
          piVar13 = (this->writTasks_).
                    super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
                    super__Deque_impl_data._M_start._M_last;
          ppiVar14 = (this->writTasks_).
                     super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
                     super__Deque_impl_data._M_start._M_node;
          do {
            if (((piVar10->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr != (element_type *)0x0) ||
               (this_01 = (piVar10->buffer_).
                          super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               this_01 == (Buffer *)0x0)) break;
            local_68.iov_base = Buffer::data(this_01);
            local_68.iov_len =
                 Buffer::size((piVar10->buffer_).
                              super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            if (iStack_80._M_current == local_78) {
              std::vector<iovec,std::allocator<iovec>>::_M_realloc_insert<iovec_const&>
                        ((vector<iovec,std::allocator<iovec>> *)&local_88,iStack_80,&local_68);
            }
            else {
              (iStack_80._M_current)->iov_base = local_68.iov_base;
              (iStack_80._M_current)->iov_len = local_68.iov_len;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
            piVar10 = piVar10 + 1;
            if (piVar10 == piVar13) {
              piVar10 = ppiVar14[1];
              ppiVar14 = ppiVar14 + 1;
              piVar13 = piVar10 + 9;
            }
          } while (piVar10 != piVar12);
        }
        uVar6 = writev(((this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->fd_,(iovec *)local_88,
                       (int)((ulong)((long)iStack_80._M_current - (long)local_88) >> 4));
        if ((int)uVar6 < 1) {
          if ((int)uVar6 != 0) {
            piVar5 = __errno_location();
            bVar9 = true;
            if (*piVar5 == 0xb) goto LAB_001127c1;
          }
          bVar9 = true;
          handleErroEvent(this);
        }
        else {
          do {
            oVar7 = Buffer::size((((this->writTasks_).
                                   super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_cur)->buffer_).
                                 super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                );
            if ((long)(uVar6 & 0xffffffff) < oVar7) {
              bVar9 = true;
              Buffer::retrieve((((this->writTasks_).
                                 super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
                                 _M_impl.super__Deque_impl_data._M_start._M_cur)->buffer_).
                               super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               uVar6 & 0xffffffff);
              goto LAB_001127c1;
            }
            _Var3._M_head_impl =
                 (((this->writTasks_).
                   super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur)->handler_)._M_t.
                 super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
                 .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
            if ((_Any_data *)_Var3._M_head_impl != (_Any_data *)0x0) {
              if (*(long *)&((_Var3._M_head_impl)->super__Function_base)._M_manager == 0) {
                std::__throw_bad_function_call();
              }
              (*(_Var3._M_head_impl)->_M_invoker)((_Any_data *)_Var3._M_head_impl);
              if (this->destroy_ != false) {
                bVar9 = true;
                goto LAB_001127c1;
              }
            }
            uVar11 = (int)uVar6 - (int)oVar7;
            uVar6 = (ulong)uVar11;
            std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::pop_front(&this->writTasks_);
          } while (0 < (int)uVar11);
          bVar9 = false;
        }
LAB_001127c1:
        if (local_88 != (Connection *)0x0) {
          operator_delete(local_88);
        }
      }
      else {
        local_88 = (Connection *)piVar10->offset_;
        sVar4 = sendfile(((this->socket_).
                          super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->fd_,
                         peVar1->fd_,(off_t *)&local_88,piVar10->len_);
        uVar11 = (uint)sVar4;
        if ((int)uVar11 < 1) {
          if (uVar11 != 0) {
            piVar5 = __errno_location();
            bVar9 = true;
            if (*piVar5 == 0xb) goto LAB_001127d0;
          }
          bVar9 = true;
          handleErroEvent(this);
        }
        else {
          lVar8 = piVar10->len_ - (ulong)(uVar11 & 0x7fffffff);
          if (lVar8 == 0) {
            p_Var2 = (_Any_data *)
                     (piVar10->handler_)._M_t.
                     super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
                     .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
            if (p_Var2 != (_Any_data *)0x0) {
              if (*(long *)(p_Var2 + 1) == 0) {
                std::__throw_bad_function_call();
              }
              (**(code **)((long)p_Var2->_M_pod_data + 0x18))(p_Var2);
            }
            std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::pop_front(&this->writTasks_);
            bVar9 = false;
          }
          else {
            piVar10->len_ = lVar8;
            piVar10->offset_ = piVar10->offset_ + (ulong)(uVar11 & 0x7fffffff);
            bVar9 = true;
          }
        }
      }
LAB_001127d0:
      if (bVar9) break;
      piVar10 = (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      piVar12 = (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
    } while (piVar12 != piVar10);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void Connection::handleWritEvent() {
    //    if (writTasks_.empty()) {
    //
    //        return;
    //    }

    auto x = self_;
    DeferCaller([this] {
        if (destroy_)
            return;
        if (writTasks_.empty())
            enableWrit(false);
    });
    //    enableWrit(false);

    //    ssize_t bytes = 0; // 注: sendfile的字节数不计入bytes中
    while (!writTasks_.empty()) {
        auto &first = writTasks_.front();
        if (first.fp_) {
            off_t offset = first.offset_;
            int ret = socket_->sendfile(first.fp_->fd(), &offset, first.len_);
            if (ret <= 0) {
                if (ret != 0 && errno == EAGAIN) {
                    return;
                } else {
                    handleErroEvent();
                    return;
                }
            } else if (ret == first.len_) {
                if (first.handler_) {
                    (*first.handler_)();
                }
                writTasks_.pop_front();
                continue;
            } else {
                first.len_ -= ret;
                first.offset_ += ret;
                return;
            }
        } else {
            std::vector<struct iovec> iov;
            for (auto &x : writTasks_) {
                if (!x.fp_ && x.buffer_) {
                    struct iovec v;
                    v.iov_base = x.buffer_->data();
                    v.iov_len = x.buffer_->size();
                    iov.push_back(v);
                } else {
                    break;
                }
            }
            auto ret = socket_->writev(&iov[0], iov.size());
            if (ret > 0) {
                while (ret > 0) {
                    auto firstBufferSize = writTasks_.front().buffer_->size();
                    if (firstBufferSize <= ret) {
                        ret -= firstBufferSize;
                        if (writTasks_.front().handler_) {
                            (*writTasks_.front().handler_)();
                            if (destroy_)
                                return;
                        }
                        writTasks_.pop_front();
                    } else {
                        writTasks_.front().buffer_->retrieve(ret);
                        return;
                    }
                }
            } else {
                if (ret != 0 && errno == EAGAIN) {
                    return;
                } else {
                    handleErroEvent();
                    return;
                }
            }
        }
    }
}